

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Probe(int source,int tag,MPIABI_Comm comm,MPIABI_Status *status)

{
  int iVar1;
  undefined4 in_register_0000003c;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Probe(CONCAT44(in_register_0000003c,source));
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Probe(
  int source,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Status * status
) {
  return MPI_Probe(
    source,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}